

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntryRaw(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  ulong uVar8;
  JavascriptString *s;
  uint32 index;
  uint idxArg;
  int64 j;
  ulong nValue;
  int in_stack_00000010;
  undefined1 local_2a8 [8];
  Builder<256U> stringBuilder;
  anon_class_16_2_2579f24f append;
  CallInfo callInfo_local;
  RecyclableObject *callSite;
  undefined1 local_58 [8];
  ArgumentReader args;
  Var rawVar;
  ScriptContext *scriptContext;
  RecyclableObject *raw;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  append.stringBuilder = (Builder<256U> *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x616,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bbe3c4;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_58,(CallInfo *)&append.stringBuilder,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  rawVar = pSVar1;
  if (((ulong)append.stringBuilder & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x619,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bbe3c4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((local_58._0_4_ & 0xfffffe) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)local_58,1);
    BVar4 = JavascriptConversion::ToObject(pvVar7,pSVar1,(RecyclableObject **)&callInfo_local);
    if (BVar4 != 0) {
      iVar5 = (**(code **)(*(long *)callInfo_local + 0x90))
                        (callInfo_local,callInfo_local,0x12a,&args.super_Arguments.Values,0,pSVar1);
      if (iVar5 != 1) {
        args.super_Arguments.Values =
             (Type)(((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      BVar4 = JavascriptConversion::ToObject
                        (args.super_Arguments.Values,pSVar1,(RecyclableObject **)&scriptContext);
      if (BVar4 != 0) {
        pvVar7 = JavascriptOperators::OP_GetLength(scriptContext,pSVar1);
        uVar8 = JavascriptConversion::ToLength(pvVar7,pSVar1);
        if ((long)uVar8 < 1) {
          s = JavascriptLibrary::GetEmptyString((pSVar1->super_ScriptContextBase).javascriptLibrary)
          ;
        }
        else {
          pvVar7 = JavascriptOperators::OP_GetElementI_UInt32(scriptContext,0,pSVar1);
          s = JavascriptConversion::ToString(pvVar7,pSVar1);
          if (uVar8 != 1) {
            CompoundString::Builder<256U>::Builder((Builder<256U> *)local_2a8,pSVar1);
            CompoundString::Builder<256U>::Append((Builder<256U> *)local_2a8,s);
            stringBuilder._544_8_ = &rawVar;
            nValue = 0xfffffffe;
            if (uVar8 < 0xfffffffe) {
              nValue = uVar8;
            }
            append.scriptContext = (ScriptContext **)local_2a8;
            index = 1;
            while ((uint32)nValue != index) {
              idxArg = index + 1;
              if (idxArg < (local_58._0_4_ & 0xffffff)) {
                pvVar7 = Arguments::operator[]((Arguments *)local_58,idxArg);
                EntryRaw::anon_class_16_2_2579f24f::operator()
                          ((anon_class_16_2_2579f24f *)&stringBuilder.isFinalized,pvVar7);
              }
              pvVar7 = JavascriptOperators::OP_GetElementI_UInt32
                                 (scriptContext,index,(ScriptContext *)rawVar);
              EntryRaw::anon_class_16_2_2579f24f::operator()
                        ((anon_class_16_2_2579f24f *)&stringBuilder.isFinalized,pvVar7);
              index = idxArg;
            }
            for (; pSVar1 = scriptContext, (long)nValue < (long)uVar8; nValue = nValue + 1) {
              pvVar7 = JavascriptNumber::ToVar(nValue,(ScriptContext *)rawVar);
              pvVar7 = JavascriptOperators::OP_GetElementI(pSVar1,pvVar7,(ScriptContext *)rawVar);
              EntryRaw::anon_class_16_2_2579f24f::operator()
                        ((anon_class_16_2_2579f24f *)&stringBuilder.isFinalized,pvVar7);
            }
            s = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_2a8);
          }
        }
        return s;
      }
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec36,L"String.raw");
}

Assistant:

Var JavascriptString::EntryRaw(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        RecyclableObject* callSite;
        RecyclableObject* raw;
        Var rawVar;

        // Call ToObject on the first argument to get the callSite (which is also cooked string array)
        // ToObject returns false if the parameter is null or undefined
        if (!JavascriptConversion::ToObject(args[1], scriptContext, &callSite))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        // Get the raw property from the callSite object
        if (!callSite->GetProperty(callSite, Js::PropertyIds::raw, &rawVar, nullptr, scriptContext))
        {
            rawVar = scriptContext->GetLibrary()->GetUndefined();
        }

        if (!JavascriptConversion::ToObject(rawVar, scriptContext, &raw))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("String.raw"));
        }

        int64 length = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(raw, scriptContext), scriptContext);

        // If there are no raw strings (somehow), return empty string
        if (length <= 0)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Get the first raw string
        Var var = JavascriptOperators::OP_GetElementI_UInt32(raw, 0, scriptContext);
        JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);

        // If there is only one raw string, just return that one raw string (doesn't matter if there are replacements)
        if (length == 1)
        {
            return string;
        }

        // We aren't going to bail early so let's create a StringBuilder and put the first raw string in there
        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> stringBuilder(scriptContext);
        stringBuilder.Append(string);

        // Each raw string is followed by a substitution expression except for the last one
        // We will always have one more string constant than substitution expression
        // `strcon1 ${expr1} strcon2 ${expr2} strcon3` = strcon1 + expr1 + strcon2 + expr2 + strcon3
        //
        // strcon1 --- step 1 (above)
        // expr1   \__ step 2
        // strcon2 /
        // expr2   \__ step 3
        // strcon3 /
        const auto append = [&] (Var var)
        {
            JavascriptString* string = JavascriptConversion::ToString(var, scriptContext);
                stringBuilder.Append(string);
        };
        uint32 loopMax = length >= UINT_MAX ? UINT_MAX-1 : (uint32)length;
        uint32 i = 1;
        uint32 argsCount = args.Info.Count;
        for (; i < loopMax; ++i)
        {
            // First append the next substitution expression if available
            if (i + 1 < argsCount)
            {
                append(args[i + 1]);
            }

            // Then append the next string (this will also cover the final string case)
            append(JavascriptOperators::OP_GetElementI_UInt32(raw, i, scriptContext));
        }

        // Length can be greater than uint32 max (unlikely in practice)
        for (int64 j = (int64)i; j < length; ++j)
        {
            // Append whatever is left in the array/object
            append(JavascriptOperators::OP_GetElementI(raw, JavascriptNumber::ToVar(j, scriptContext), scriptContext));
        }

        // CompoundString::Builder has saved our lives
        return stringBuilder.ToString();
    }